

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::JsonCodec::handleByAnnotation(JsonCodec *this,Schema schema)

{
  HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_> *this_00;
  RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
  **ppRVar1;
  short sVar2;
  Impl *pIVar3;
  Entry *pEVar4;
  SegmentReader *pSVar5;
  SegmentReader *pSVar6;
  Table<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Callbacks>_>
  *pTVar7;
  undefined8 uVar8;
  anon_union_8_2_eba6ea51_for_Type_5 aVar9;
  Entry *pEVar10;
  StructSchema schema_00;
  size_t newSize;
  SegmentReader *pSVar11;
  Type type;
  ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
  table;
  Type type_00;
  bool success;
  Vector<capnp::Schema> dependencies;
  EnumSchema enumSchema;
  size_t pos;
  undefined1 local_d1;
  Schema local_d0;
  undefined1 local_c8 [48];
  Disposer *local_98;
  AnnotatedEnumHandler *local_90;
  anon_union_8_2_eba6ea51_for_Type_5 local_88;
  WirePointer local_80;
  Maybe<kj::StringPtr> local_78;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_60;
  
  local_d0.raw = schema.raw;
  Schema::getProto((Reader *)local_c8,&local_d0);
  if (0x6f < (uint)local_c8._32_4_) {
    sVar2 = *(short *)((long)&(((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
                                 *)local_c8._16_8_)->builder).pos + 4);
    if (sVar2 == 2) {
      local_88 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum(&local_d0);
      pIVar3 = (this->impl).ptr;
      pEVar10 = (pIVar3->annotatedEnumHandlers).table.rows.builder.ptr;
      local_80 = (WirePointer)
                 ((long)(pIVar3->annotatedEnumHandlers).table.rows.builder.pos - (long)pEVar10 >> 5)
      ;
      table.size_ = (size_t)pEVar10;
      table.ptr = (Entry *)&(pIVar3->annotatedEnumHandlers).table.indexes;
      kj::
      HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
      ::
      insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Entry,capnp::EnumSchema&>
                ((HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
                  *)local_c8,table,(size_t)local_80,(EnumSchema *)local_80);
      if (local_c8[0] ==
          (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
           )0x0) {
        this_00 = &pIVar3->annotatedEnumHandlers;
        local_c8._8_8_ = &local_d1;
        local_d1 = 0;
        local_c8[0] = (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::Callbacks>
                       )0x1;
        local_c8._24_8_ = &local_80;
        local_c8._16_8_ = this_00;
        local_c8._32_8_ = &local_88;
        kj::heap<capnp::JsonCodec::AnnotatedEnumHandler,capnp::EnumSchema&>
                  ((kj *)&local_98,(EnumSchema *)&local_88);
        type_00.field_4.schema = local_88.schema;
        type_00.baseType = ENUM;
        type_00.listDepth = '\0';
        type_00.isImplicitParam = false;
        type_00.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        type_00._6_2_ = 0;
        addTypeHandlerImpl(this,type_00,(HandlerBase *)local_90);
        aVar9 = local_88;
        pEVar10 = (pIVar3->annotatedEnumHandlers).table.rows.builder.pos;
        if (pEVar10 == (pIVar3->annotatedEnumHandlers).table.rows.builder.endPtr) {
          pEVar4 = (this_00->table).rows.builder.ptr;
          newSize = 4;
          if (pEVar10 != pEVar4) {
            newSize = (long)pEVar10 - (long)pEVar4 >> 4;
          }
          kj::
          Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
          ::setCapacity((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
                         *)this_00,newSize);
          pEVar10 = (pIVar3->annotatedEnumHandlers).table.rows.builder.pos;
        }
        (pEVar10->key).baseType = ENUM;
        (pEVar10->key).listDepth = '\0';
        (pEVar10->key).field_4.schema = (RawBrandedSchema *)aVar9;
        (pEVar10->value).disposer = local_98;
        (pEVar10->value).ptr = local_90;
        ppRVar1 = &(pIVar3->annotatedEnumHandlers).table.rows.builder.pos;
        *ppRVar1 = *ppRVar1 + 1;
        local_d1 = 1;
        kj::_::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
        ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                     *)local_c8);
      }
    }
    else if (sVar2 == 1) {
      Schema::getProto((Reader *)local_c8,&local_d0);
      if (((uint)local_c8._32_4_ < 0x40) ||
         ((((Vector<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry>
             *)local_c8._16_8_)->builder).ptr != (Entry *)0xa3fa7845f919dd83)) {
        local_c8._0_8_ = (SegmentReader *)0x0;
        local_c8._8_8_ = (SegmentReader *)0x0;
        local_c8._16_8_ =
             (Table<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Callbacks>_>
              *)0x0;
        local_c8._24_8_ = &kj::NullArrayDisposer::instance;
        schema_00 = Schema::asStruct(&local_d0);
        local_60.ptr.isSet = false;
        local_78.ptr.isSet = false;
        loadAnnotatedHandler(this,schema_00,&local_60,&local_78,(Vector<capnp::Schema> *)local_c8);
        uVar8 = local_c8._8_8_;
        pSVar5 = (SegmentReader *)local_c8._0_8_;
        pSVar6 = (SegmentReader *)local_c8._8_8_;
        pTVar7 = (Table<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Callbacks>_>
                  *)local_c8._16_8_;
        for (pSVar11 = (SegmentReader *)local_c8._0_8_; pSVar11 != (SegmentReader *)uVar8;
            pSVar11 = (SegmentReader *)&pSVar11->id) {
          local_c8._0_8_ = pSVar5;
          local_c8._8_8_ = pSVar6;
          local_c8._16_8_ = pTVar7;
          handleByAnnotation(this,(RawBrandedSchema *)pSVar11->arena);
          pSVar5 = (SegmentReader *)local_c8._0_8_;
          pSVar6 = (SegmentReader *)local_c8._8_8_;
          pTVar7 = (Table<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Callbacks>_>
                    *)local_c8._16_8_;
        }
        if (pSVar5 != (SegmentReader *)0x0) {
          local_c8._0_8_ = (SegmentReader *)0x0;
          local_c8._8_8_ = (CapTableReader *)0x0;
          local_c8._16_8_ =
               (Table<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,_std::nullptr_t>_>::Callbacks>_>
                *)0x0;
          (**(code **)*(WirePointer *)local_c8._24_8_)
                    (local_c8._24_8_,pSVar5,8,(long)pSVar6 - (long)pSVar5 >> 3,
                     (long)pTVar7 - (long)pSVar5 >> 3,0);
        }
      }
      else {
        aVar9 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct(&local_d0);
        type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)
                       (anon_union_8_2_eba6ea51_for_Type_5)aVar9.schema;
        type.baseType = STRUCT;
        type.listDepth = '\0';
        type.isImplicitParam = false;
        type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
        type._6_2_ = 0;
        addTypeHandlerImpl(this,type,(HandlerBase *)&handleByAnnotation::GLOBAL_HANDLER);
      }
    }
  }
  return;
}

Assistant:

void JsonCodec::handleByAnnotation(Schema schema) {
  switch (schema.getProto().which()) {
    case schema::Node::STRUCT: {
      if (schema.getProto().getId() == capnp::typeId<JsonValue>()) {
        // Special handler for JsonValue.
        static JsonValueHandler GLOBAL_HANDLER;
        addTypeHandler(schema.asStruct(), GLOBAL_HANDLER);
      } else {
        kj::Vector<Schema> dependencies;
        loadAnnotatedHandler(schema.asStruct(), kj::none, kj::none, dependencies);
        for (auto dep: dependencies) {
          handleByAnnotation(dep);
        }
      }
      break;
    }
    case schema::Node::ENUM: {
      auto enumSchema = schema.asEnum();
      impl->annotatedEnumHandlers.findOrCreate(enumSchema, [&]() {
        auto handler = kj::heap<AnnotatedEnumHandler>(enumSchema);
        addTypeHandler(enumSchema, *handler);
        return kj::HashMap<Type, kj::Own<AnnotatedEnumHandler>>::Entry {
            enumSchema, kj::mv(handler) };
      });
      break;
    }
    default:
      break;
  }
}